

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

string * __thiscall
cli::Parser::CmdArgument<bool>::print_value_abi_cxx11_
          (string *__return_storage_ptr__,CmdArgument<bool> *this)

{
  stringify<bool>(__return_storage_ptr__,&this->value);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string print_value() const {
				return stringify(value);
			}